

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.h
# Opt level: O0

bool tcmalloc::commandlineflags::StringToBool(char *value,bool def)

{
  char cVar1;
  bool def_local;
  char *value_local;
  undefined1 local_1;
  
  local_1 = def;
  if (value != (char *)0x0) {
    cVar1 = *value;
    if ((((cVar1 == '\0') || (cVar1 == '1')) || (cVar1 == 'T')) ||
       (((cVar1 == 'Y' || (cVar1 == 't')) || (cVar1 == 'y')))) {
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)local_1;
}

Assistant:

inline bool StringToBool(const char *value, bool def) {
      if (!value) {
        return def;
      }
      switch (value[0]) {
      case 't':
      case 'T':
      case 'y':
      case 'Y':
      case '1':
      case '\0':
        return true;
      }
      return false;
    }